

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execNegEa<(moira::Instr)83,(moira::Mode)7,(moira::Size)2>(Moira *this,u16 opcode)

{
  u32 addr;
  u32 uVar1;
  bool bVar2;
  ulong uVar3;
  bool error;
  bool local_19;
  
  addr = computeEA<(moira::Mode)7,(moira::Size)2,0ul>(this,opcode & 7);
  uVar1 = readM<(moira::MemSpace)1,(moira::Size)2,0ul>(this,addr,&local_19);
  if (local_19 == false) {
    uVar3 = -(ulong)uVar1;
    bVar2 = (bool)((byte)(uVar3 >> 0x10) & 1);
    (this->reg).sr.c = bVar2;
    (this->reg).sr.x = bVar2;
    (this->reg).sr.v = (bool)((byte)((uVar1 & (uint)uVar3) >> 0xf) & 1);
    (this->reg).sr.z = (short)uVar3 == 0;
    (this->reg).sr.n = (bool)((byte)(uVar3 >> 0xf) & 1);
    uVar1 = (this->reg).pc;
    (this->reg).pc0 = uVar1;
    (this->queue).ird = (this->queue).irc;
    uVar1 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar1 + 2);
    (this->queue).irc = (u16)uVar1;
    writeM<(moira::MemSpace)1,(moira::Size)2,4ul>(this,addr,(uint)uVar3);
  }
  return;
}

Assistant:

void
Moira::execNegEa(u16 opcode)
{
    int dst = ( _____________xxx(opcode) );
    u32 ea, data;

    if (!readOp<M,S,STD_AE_FRAME>(dst, ea, data)) return;
    
    data = logic<I,S>(data);
    prefetch();

    writeOp<M,S,POLLIPL>(dst, ea, data);
}